

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QByteArray,_QPalette>::emplace_helper<QPalette>
          (QHash<QByteArray,_QPalette> *this,QByteArray *key,QPalette *args)

{
  QPalettePrivate *pQVar1;
  Data *pDVar2;
  char *pcVar3;
  qsizetype qVar4;
  piter pVar5;
  uchar *puVar6;
  long in_FS_OFFSET;
  undefined1 local_48 [24];
  QPalette local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QPalette>_>::findOrInsert<QByteArray>
            ((InsertionResult *)local_48,this->d,key);
  puVar6 = (((*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].entries)->storage).data
           + (uint)(*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].offsets
                   [(uint)local_48._8_8_ & 0x7f] * 0x28;
  if (local_48[0x10] == false) {
    pDVar2 = (key->d).d;
    (key->d).d = (Data *)0x0;
    *(Data **)puVar6 = pDVar2;
    pcVar3 = (key->d).ptr;
    (key->d).ptr = (char *)0x0;
    *(char **)(puVar6 + 8) = pcVar3;
    qVar4 = (key->d).size;
    (key->d).size = 0;
    *(qsizetype *)(puVar6 + 0x10) = qVar4;
    pQVar1 = args->d;
    args->d = (QPalettePrivate *)0x0;
    *(QPalettePrivate **)(puVar6 + 0x18) = pQVar1;
    *(ColorGroup *)(puVar6 + 0x20) = args->currentGroup;
  }
  else {
    pQVar1 = args->d;
    args->d = (QPalettePrivate *)0x0;
    local_30.currentGroup = *(ColorGroup *)(puVar6 + 0x20);
    *(ColorGroup *)(puVar6 + 0x20) = args->currentGroup;
    local_30.d = *(QPalettePrivate **)(puVar6 + 0x18);
    *(QPalettePrivate **)(puVar6 + 0x18) = pQVar1;
    QPalette::~QPalette(&local_30);
  }
  pVar5.bucket = local_48._8_8_;
  pVar5.d = (Data<QHashPrivate::Node<QByteArray,_QPalette>_> *)local_48._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar5;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }